

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::EliminateDeadMembersPass::UpdateOpGroupMemberDecorate
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  initializer_list<unsigned_int> init_list;
  uint32_t uVar1;
  Op OVar2;
  uint32_t uVar3;
  Operand *pOVar4;
  size_type sVar5;
  IRContext *pIVar6;
  uint32_t local_bc;
  iterator local_b8;
  undefined8 local_b0;
  SmallVector<unsigned_int,_2UL> local_a8;
  Operand local_80;
  uint32_t local_50;
  uint32_t local_4c;
  uint32_t new_member_idx;
  uint32_t member_idx;
  uint32_t type_id;
  uint32_t i;
  OperandList new_operands;
  bool modified;
  Instruction *inst_local;
  EliminateDeadMembersPass *this_local;
  
  OVar2 = opt::Instruction::opcode(inst);
  if (OVar2 != OpGroupMemberDecorate) {
    __assert_fail("inst->opcode() == spv::Op::OpGroupMemberDecorate",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                  ,0x192,
                  "bool spvtools::opt::EliminateDeadMembersPass::UpdateOpGroupMemberDecorate(Instruction *)"
                 );
  }
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&type_id);
  pOVar4 = opt::Instruction::GetInOperand(inst,0);
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  emplace_back<spvtools::opt::Operand&>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&type_id,
             pOVar4);
  for (member_idx = 1; uVar1 = member_idx, uVar3 = opt::Instruction::NumInOperands(inst),
      uVar1 < uVar3; member_idx = member_idx + 2) {
    new_member_idx = opt::Instruction::GetSingleWordInOperand(inst,member_idx);
    local_4c = opt::Instruction::GetSingleWordInOperand(inst,member_idx + 1);
    local_50 = GetNewMemberIndex(this,new_member_idx,local_4c);
    if (local_50 == 0xffffffff) {
      new_operands.
      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    }
    else {
      pOVar4 = opt::Instruction::GetOperand(inst,member_idx);
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      emplace_back<spvtools::opt::Operand&>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&type_id,
                 pOVar4);
      if (local_50 == local_4c) {
        pOVar4 = opt::Instruction::GetOperand(inst,member_idx + 1);
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        emplace_back<spvtools::opt::Operand&>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&type_id
                   ,pOVar4);
      }
      else {
        local_bc = local_50;
        local_b8 = &local_bc;
        local_b0 = 1;
        init_list._M_len = 1;
        init_list._M_array = local_b8;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a8,init_list);
        Operand::Operand(&local_80,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_a8);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &type_id,&local_80);
        Operand::~Operand(&local_80);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a8);
        new_operands.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      }
    }
  }
  if ((new_operands.
       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    sVar5 = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::size
                      ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                       &type_id);
    if (sVar5 == 1) {
      pIVar6 = Pass::context((Pass *)this);
      IRContext::KillInst(pIVar6,inst);
      this_local._7_1_ = true;
    }
    else {
      opt::Instruction::SetInOperands(inst,(OperandList *)&type_id);
      pIVar6 = Pass::context((Pass *)this);
      IRContext::UpdateDefUse(pIVar6,inst);
      this_local._7_1_ = true;
    }
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&type_id);
  return this_local._7_1_;
}

Assistant:

bool EliminateDeadMembersPass::UpdateOpGroupMemberDecorate(Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpGroupMemberDecorate);

  bool modified = false;

  Instruction::OperandList new_operands;
  new_operands.emplace_back(inst->GetInOperand(0));
  for (uint32_t i = 1; i < inst->NumInOperands(); i += 2) {
    uint32_t type_id = inst->GetSingleWordInOperand(i);
    uint32_t member_idx = inst->GetSingleWordInOperand(i + 1);
    uint32_t new_member_idx = GetNewMemberIndex(type_id, member_idx);

    if (new_member_idx == kRemovedMember) {
      modified = true;
      continue;
    }

    new_operands.emplace_back(inst->GetOperand(i));
    if (new_member_idx != member_idx) {
      new_operands.emplace_back(
          Operand({SPV_OPERAND_TYPE_LITERAL_INTEGER, {new_member_idx}}));
      modified = true;
    } else {
      new_operands.emplace_back(inst->GetOperand(i + 1));
    }
  }

  if (!modified) {
    return false;
  }

  if (new_operands.size() == 1) {
    context()->KillInst(inst);
    return true;
  }

  inst->SetInOperands(std::move(new_operands));
  context()->UpdateDefUse(inst);
  return true;
}